

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZBSpStructMatrix.cpp
# Opt level: O2

TPZStructMatrix * __thiscall
TPZBSpStructMatrix<double,_TPZStructMatrixOT<double>_>::Clone
          (TPZBSpStructMatrix<double,_TPZStructMatrixOT<double>_> *this)

{
  TPZStructMatrix *this_00;
  
  this_00 = (TPZStructMatrix *)operator_new(0x130);
  TPZBSpStructMatrix((TPZBSpStructMatrix<double,_TPZStructMatrixOT<double>_> *)this_00,this);
  return this_00;
}

Assistant:

TPZStructMatrix * TPZBSpStructMatrix<TVar,TPar>::Clone(){
    return new TPZBSpStructMatrix(*this);
}